

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
::InnerMap::clear(InnerMap *this)

{
  void **ppvVar1;
  Node *pNVar2;
  LogMessage *other;
  _Base_ptr p_Var3;
  ulong uVar4;
  Node *node;
  const_iterator __position;
  ulong uVar5;
  LogFinisher local_71;
  _Base_ptr local_70;
  LogMessage local_68;
  
  uVar4 = this->num_buckets_;
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      ppvVar1 = this->table_;
      node = (Node *)ppvVar1[uVar5];
      if (node != (Node *)0x0) {
        if (node == (Node *)ppvVar1[uVar5 ^ 1]) {
          if ((node != (Node *)0x0) && (node == (Node *)ppvVar1[uVar5 ^ 1])) {
            if (((uVar5 & 1) != 0) || (node != (Node *)ppvVar1[uVar5 + 1])) {
              internal::LogMessage::LogMessage
                        (&local_68,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                         ,0x28f);
              other = internal::LogMessage::operator<<
                                (&local_68,
                                 "CHECK failed: table_[b] == table_[b + 1] && (b & 1) == 0: ");
              internal::LogFinisher::operator=(&local_71,other);
              internal::LogMessage::~LogMessage(&local_68);
            }
            this->table_[uVar5 + 1] = (void *)0x0;
            this->table_[uVar5] = (void *)0x0;
            local_70 = (_Base_ptr)&node->field_0x10;
            __position._M_node = *(_Base_ptr *)&node->field_0x20;
            do {
              pNVar2 = (Node *)__position._M_node[1]._M_parent;
              p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
              std::
              _Rb_tree<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>,_google::protobuf::internal::TransparentSupport<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::less,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>_>
              ::_M_erase_aux((_Rb_tree<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>,_google::protobuf::internal::TransparentSupport<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::less,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>_>
                              *)node,__position);
              DestroyNode(this,pNVar2);
              __position._M_node = p_Var3;
            } while (p_Var3 != local_70);
            DestroyTree(this,(Tree *)node);
            uVar5 = uVar5 + 1;
          }
        }
        else {
          ppvVar1[uVar5] = (void *)0x0;
          do {
            pNVar2 = node->next;
            DestroyNode(this,node);
            node = pNVar2;
          } while (pNVar2 != (Node *)0x0);
        }
      }
      uVar5 = uVar5 + 1;
      uVar4 = this->num_buckets_;
    } while (uVar5 < uVar4);
  }
  this->num_elements_ = 0;
  this->index_of_first_non_null_ = uVar4;
  return;
}

Assistant:

void clear() {
      for (size_type b = 0; b < num_buckets_; b++) {
        if (TableEntryIsNonEmptyList(b)) {
          Node* node = static_cast<Node*>(table_[b]);
          table_[b] = nullptr;
          do {
            Node* next = node->next;
            DestroyNode(node);
            node = next;
          } while (node != nullptr);
        } else if (TableEntryIsTree(b)) {
          Tree* tree = static_cast<Tree*>(table_[b]);
          GOOGLE_DCHECK(table_[b] == table_[b + 1] && (b & 1) == 0);
          table_[b] = table_[b + 1] = nullptr;
          typename Tree::iterator tree_it = tree->begin();
          do {
            Node* node = NodeFromTreeIterator(tree_it);
            typename Tree::iterator next = tree_it;
            ++next;
            tree->erase(tree_it);
            DestroyNode(node);
            tree_it = next;
          } while (tree_it != tree->end());
          DestroyTree(tree);
          b++;
        }
      }
      num_elements_ = 0;
      index_of_first_non_null_ = num_buckets_;
    }